

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall ON_SubDMeshFragment::IsFullFaceFragment(ON_SubDMeshFragment *this)

{
  bool local_11;
  ON_SubDMeshFragment *this_local;
  
  local_11 = false;
  if ((((((this->m_face != (ON_SubDFace *)0x0) &&
         (local_11 = false, this->m_face->m_edge_count == 4)) &&
        (local_11 = false, this->m_face_fragment_count == 1)) &&
       ((local_11 = false, this->m_face_fragment_index == 0 &&
        (local_11 = false, this->m_face_vertex_index[0] == 0)))) &&
      ((local_11 = false, this->m_face_vertex_index[1] == 1 &&
       ((local_11 = false, this->m_face_vertex_index[2] == 2 &&
        (local_11 = false, this->m_face_vertex_index[3] == 3)))))) &&
     (local_11 = false, (this->m_grid).m_side_segment_count != '\0')) {
    local_11 = (this->m_grid).m_S != (uint *)0x0;
  }
  return local_11;
}

Assistant:

bool ON_SubDMeshFragment::IsFullFaceFragment() const
{
  return
    nullptr != m_face
    && 4 == m_face->m_edge_count
    && 1 == m_face_fragment_count
    && 0 == m_face_fragment_index
    && 0 == m_face_vertex_index[0]
    && 1 == m_face_vertex_index[1]
    && 2 == m_face_vertex_index[2]
    && 3 == m_face_vertex_index[3]
    && m_grid.m_side_segment_count > 0 && nullptr != m_grid.m_S
    ;
}